

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

bool __thiscall c4::yml::Parser::_handle_types(Parser *this)

{
  Location LVar1;
  Location LVar2;
  Location LVar3;
  Location LVar4;
  Location LVar5;
  Location LVar6;
  Location LVar7;
  Location LVar8;
  Location LVar9;
  ro_substr pattern;
  ro_substr pattern_00;
  ro_substr pattern_01;
  ro_substr chars;
  csubstr tag_00;
  ro_substr chars_00;
  ro_substr pattern_02;
  ro_substr pattern_03;
  csubstr tag_01;
  csubstr anchor;
  ro_substr chars_01;
  ro_substr chars_02;
  csubstr s;
  csubstr tag_02;
  csubstr val;
  csubstr fmt;
  bool bVar10;
  YamlTag_e YVar11;
  int iVar12;
  error_flags eVar13;
  Parser *in_RDI;
  csubstr scalar;
  YamlTag_e tag;
  char msg_8 [34];
  char msg_7 [34];
  char msg_6 [34];
  size_t pos;
  char msg_5 [61];
  size_t tag_indentation;
  char msg_4 [30];
  char msg_3 [27];
  char msg_2 [27];
  char msg_1 [27];
  char msg [27];
  csubstr t;
  csubstr rem;
  flag_t in_stack_fffffffffffff7ac;
  Parser *in_stack_fffffffffffff7b0;
  Parser *this_00;
  size_t in_stack_fffffffffffff7b8;
  size_t l;
  size_t in_stack_fffffffffffff7c0;
  basic_substring<const_char> *in_stack_fffffffffffff7c8;
  basic_substring<const_char> *n;
  undefined7 in_stack_fffffffffffff7d0;
  char in_stack_fffffffffffff7d7;
  basic_substring<const_char> *in_stack_fffffffffffff7d8;
  size_t in_stack_fffffffffffff7e0;
  basic_substring<const_char> *in_stack_fffffffffffff7e8;
  undefined7 in_stack_fffffffffffff7f0;
  undefined1 in_stack_fffffffffffff7f7;
  basic_substring<const_char> *in_stack_fffffffffffff7f8;
  csubstr *node;
  undefined7 in_stack_fffffffffffff800;
  char in_stack_fffffffffffff807;
  undefined1 uVar14;
  basic_substring<const_char> *in_stack_fffffffffffff808;
  undefined7 in_stack_fffffffffffff810;
  undefined1 in_stack_fffffffffffff817;
  Tree *in_stack_fffffffffffff818;
  pfn_error in_stack_fffffffffffff820;
  basic_substring<const_char> *in_stack_fffffffffffff828;
  basic_substring<const_char> *in_stack_fffffffffffff838;
  undefined6 in_stack_fffffffffffff840;
  undefined1 in_stack_fffffffffffff846;
  undefined1 in_stack_fffffffffffff847;
  size_t in_stack_fffffffffffff848;
  basic_substring<const_char> *pbVar15;
  undefined7 in_stack_fffffffffffff850;
  undefined1 in_stack_fffffffffffff857;
  undefined8 in_stack_fffffffffffff858;
  undefined7 in_stack_fffffffffffff860;
  undefined1 in_stack_fffffffffffff867;
  char *in_stack_fffffffffffff868;
  char *pcVar16;
  Parser *in_stack_fffffffffffff870;
  pfn_error p_Var17;
  basic_substring<const_char> *in_stack_fffffffffffff888;
  undefined7 in_stack_fffffffffffff890;
  undefined1 in_stack_fffffffffffff897;
  bool local_711;
  undefined7 in_stack_fffffffffffff900;
  undefined1 in_stack_fffffffffffff907;
  basic_substring<const_char> *in_stack_fffffffffffff908;
  undefined7 in_stack_fffffffffffff910;
  undefined1 in_stack_fffffffffffff917;
  char *in_stack_fffffffffffff918;
  pfn_error in_stack_fffffffffffff920;
  undefined6 in_stack_fffffffffffff9f8;
  Parser *in_stack_fffffffffffffa00;
  undefined8 local_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  size_t local_5d0;
  undefined1 local_5c8 [56];
  basic_substring<const_char> local_590;
  basic_substring<char_const> local_580 [16];
  pfn_error local_570;
  char *local_568;
  size_t local_560;
  char *pcStack_558;
  size_t local_550;
  size_t sStack_548;
  char *local_540;
  char local_538 [40];
  basic_substring<char_const> local_510 [16];
  basic_substring<const_char> local_500;
  basic_substring<char_const> local_4f0 [16];
  char *local_4e0;
  size_t local_4d8;
  size_t local_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  size_t local_4b0;
  char local_4a8 [48];
  basic_substring<char_const> local_478 [16];
  size_t local_468;
  undefined8 local_460;
  Parser *pPStack_458;
  size_t local_450;
  size_t sStack_448;
  basic_substring<const_char> *local_440;
  char local_438 [64];
  char *local_3f8;
  size_t local_3f0;
  size_t local_3e8;
  undefined8 local_3e0;
  Parser *pPStack_3d8;
  size_t local_3d0;
  size_t sStack_3c8;
  basic_substring<const_char> *local_3c0;
  char local_3b8 [40];
  Parser *in_stack_fffffffffffffc70;
  Parser *in_stack_fffffffffffffc78;
  size_t in_stack_fffffffffffffc80;
  size_t sStack_378;
  basic_substring<const_char> *in_stack_fffffffffffffc90;
  undefined8 local_330;
  Parser *pPStack_328;
  size_t local_320;
  size_t sStack_318;
  basic_substring<const_char> *local_310;
  char local_308 [40];
  char *local_2e0;
  ulong local_2d8;
  basic_substring<char_const> local_2d0 [16];
  undefined8 local_2c0;
  Parser *pPStack_2b8;
  size_t local_2b0;
  size_t sStack_2a8;
  basic_substring<const_char> *local_2a0;
  char local_298 [40];
  char *local_270;
  ulong local_268;
  basic_substring<char_const> local_260 [16];
  undefined8 local_250;
  Parser *pPStack_248;
  size_t local_240;
  size_t sStack_238;
  basic_substring<const_char> *local_230;
  char local_228 [40];
  basic_substring<char_const> local_200 [16];
  char *local_1f0;
  ulong local_1e8;
  basic_substring<char_const> local_1e0 [16];
  basic_substring<const_char> local_1d0;
  basic_substring<const_char> local_1c0;
  bool local_1a1;
  csubstr *local_1a0;
  csubstr *local_198;
  basic_substring<const_char> *local_190;
  basic_substring<const_char> *local_188;
  csubstr *local_180;
  csubstr *local_178;
  csubstr *local_170;
  basic_substring<const_char> *local_168;
  csubstr *local_160;
  csubstr *local_158;
  csubstr *local_150;
  basic_substring<const_char> *local_148;
  char *local_140;
  basic_substring<const_char> *local_138;
  char *local_130;
  undefined4 local_128;
  size_t local_120;
  basic_substring<const_char> *local_118;
  pfn_error local_110;
  char *local_108;
  char *local_100;
  undefined4 local_f8;
  size_t local_f0;
  basic_substring<const_char> *local_e8;
  char *local_e0;
  size_t local_d8;
  char *local_d0;
  undefined4 local_c8;
  size_t local_c0;
  basic_substring<const_char> *local_b8;
  char *local_b0;
  size_t local_a8;
  char *local_a0;
  undefined4 local_98;
  size_t local_90;
  basic_substring<const_char> *local_88;
  char *local_80;
  ulong local_78;
  char *local_70;
  undefined4 local_68;
  size_t local_60;
  basic_substring<const_char> *local_58;
  char *local_50;
  ulong local_48;
  char *local_40;
  undefined4 local_38;
  undefined1 local_29;
  size_t local_28;
  basic_substring<const_char> *local_20;
  char *local_18;
  ulong local_10;
  csubstr *local_8;
  
  local_1c0 = basic_substring<const_char>::triml
                        (in_stack_fffffffffffff808,in_stack_fffffffffffff807);
  basic_substring<const_char>::basic_substring(&local_1d0);
  basic_substring<char_const>::basic_substring<3ul>(local_1e0,(char (*) [3])"!!");
  pattern.str._7_1_ = in_stack_fffffffffffff7d7;
  pattern.str._0_7_ = in_stack_fffffffffffff7d0;
  pattern.len = (size_t)in_stack_fffffffffffff7d8;
  bVar10 = basic_substring<const_char>::begins_with(in_stack_fffffffffffff7c8,pattern);
  if (bVar10) {
    basic_substring<char_const>::basic_substring<3ul>(local_200,(char (*) [3])" ,");
    chars_00.str._7_1_ = in_stack_fffffffffffff807;
    chars_00.str._0_7_ = in_stack_fffffffffffff800;
    chars_00.len = (size_t)in_stack_fffffffffffff808;
    local_60 = basic_substring<const_char>::first_of
                         (in_stack_fffffffffffff7f8,chars_00,
                          CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0));
    local_58 = &local_1c0;
    if (local_1c0.len < local_60 && local_60 != 0xffffffffffffffff) {
      eVar13 = get_error_flags();
      if (((eVar13 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
        trap_instruction();
      }
      local_70 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_68 = 0x1569;
      handle_error(0x345f1b,(char *)0x1569,"check failed: %s","pos <= len || pos == npos");
    }
    if (local_60 == 0xffffffffffffffff) {
      local_50 = local_1c0.str;
      local_48 = local_1c0.len;
    }
    else {
      basic_substring<const_char>::basic_substring
                ((basic_substring<const_char> *)
                 CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0),
                 (char *)in_stack_fffffffffffff7c8,in_stack_fffffffffffff7c0);
    }
    local_1f0 = local_50;
    local_1e8 = local_48;
    local_1d0.str = local_50;
    local_1d0.len = local_48;
    if (local_48 < 2) {
      builtin_strncpy(local_228,"check failed: (t.len >= 2)",0x1b);
      eVar13 = get_error_flags();
      if (((eVar13 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
        trap_instruction();
      }
      p_Var17 = (in_RDI->m_stack).m_callbacks.m_error;
      Location::Location((Location *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0),
                         (char *)in_stack_fffffffffffff7c8,in_stack_fffffffffffff7c0,
                         in_stack_fffffffffffff7b8,(size_t)in_stack_fffffffffffff7b0);
      in_stack_fffffffffffff7ac = (flag_t)((ulong)local_250 >> 0x20);
      LVar1.super_LineCol.line = (size_t)pPStack_248;
      LVar1.super_LineCol.offset = local_250;
      LVar1.super_LineCol.col = local_240;
      LVar1.name.str = (char *)sStack_238;
      LVar1.name.len = (size_t)local_230;
      (*p_Var17)(local_228,0x1b,LVar1,(in_RDI->m_stack).m_callbacks.m_user_data);
      in_stack_fffffffffffff7b0 = pPStack_248;
      in_stack_fffffffffffff7b8 = local_240;
      in_stack_fffffffffffff7c0 = sStack_238;
      in_stack_fffffffffffff7c8 = local_230;
    }
    local_138 = &local_1d0;
    local_140 = "!!set";
    iVar12 = basic_substring<const_char>::compare
                       (in_stack_fffffffffffff828,(char *)in_stack_fffffffffffff820,
                        (size_t)in_stack_fffffffffffff818);
    this_00 = in_stack_fffffffffffff7b0;
    l = in_stack_fffffffffffff7b8;
    n = in_stack_fffffffffffff7c8;
    if (iVar12 == 0) {
      add_flags(in_stack_fffffffffffff7b0,in_stack_fffffffffffff7ac);
      this_00 = in_stack_fffffffffffff7b0;
      l = in_stack_fffffffffffff7b8;
      n = in_stack_fffffffffffff7c8;
    }
  }
  else {
    basic_substring<char_const>::basic_substring<3ul>(local_260,(char (*) [3])"!<");
    pattern_00.str._7_1_ = in_stack_fffffffffffff7d7;
    pattern_00.str._0_7_ = in_stack_fffffffffffff7d0;
    pattern_00.len = (size_t)in_stack_fffffffffffff7d8;
    bVar10 = basic_substring<const_char>::begins_with(in_stack_fffffffffffff7c8,pattern_00);
    if (bVar10) {
      local_28 = basic_substring<const_char>::first_of
                           (in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d7,
                            (size_t)in_stack_fffffffffffff7c8);
      local_20 = &local_1c0;
      local_29 = 1;
      if (local_1c0.len < local_28 && local_28 != 0xffffffffffffffff) {
        eVar13 = get_error_flags();
        if (((eVar13 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
          trap_instruction();
        }
        local_40 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_38 = 0x1572;
        handle_error(0x345f1b,(char *)0x1572,"check failed: %s","pos <= len || pos == npos");
      }
      if (local_28 == 0xffffffffffffffff) {
        local_18 = local_1c0.str;
        local_10 = local_1c0.len;
      }
      else {
        basic_substring<const_char>::basic_substring
                  ((basic_substring<const_char> *)
                   CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0),
                   (char *)in_stack_fffffffffffff7c8,in_stack_fffffffffffff7c0);
      }
      local_270 = local_18;
      local_268 = local_10;
      local_1d0.str = local_18;
      local_1d0.len = local_10;
      this_00 = in_stack_fffffffffffff7b0;
      l = in_stack_fffffffffffff7b8;
      n = in_stack_fffffffffffff7c8;
      if (local_10 < 2) {
        builtin_strncpy(local_298,"check failed: (t.len >= 2)",0x1b);
        eVar13 = get_error_flags();
        if (((eVar13 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
          trap_instruction();
        }
        p_Var17 = (in_RDI->m_stack).m_callbacks.m_error;
        Location::Location((Location *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0)
                           ,(char *)in_stack_fffffffffffff7c8,in_stack_fffffffffffff7c0,
                           in_stack_fffffffffffff7b8,(size_t)in_stack_fffffffffffff7b0);
        in_stack_fffffffffffff7ac = (flag_t)((ulong)local_2c0 >> 0x20);
        LVar2.super_LineCol.line = (size_t)pPStack_2b8;
        LVar2.super_LineCol.offset = local_2c0;
        LVar2.super_LineCol.col = local_2b0;
        LVar2.name.str = (char *)sStack_2a8;
        LVar2.name.len = (size_t)local_2a0;
        (*p_Var17)(local_298,0x1b,LVar2,(in_RDI->m_stack).m_callbacks.m_user_data);
        this_00 = pPStack_2b8;
        l = local_2b0;
        in_stack_fffffffffffff7c0 = sStack_2a8;
        n = local_2a0;
      }
    }
    else {
      basic_substring<char_const>::basic_substring<4ul>(local_2d0,(char (*) [4])"!h!");
      pattern_01.str._7_1_ = in_stack_fffffffffffff7d7;
      pattern_01.str._0_7_ = in_stack_fffffffffffff7d0;
      pattern_01.len = (size_t)in_stack_fffffffffffff7d8;
      bVar10 = basic_substring<const_char>::begins_with(in_stack_fffffffffffff7c8,pattern_01);
      if (bVar10) {
        local_90 = basic_substring<const_char>::first_of
                             (in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d7,
                              (size_t)in_stack_fffffffffffff7c8);
        local_88 = &local_1c0;
        if (local_1c0.len < local_90 && local_90 != 0xffffffffffffffff) {
          eVar13 = get_error_flags();
          if (((eVar13 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
            trap_instruction();
          }
          local_a0 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_98 = 0x1569;
          handle_error(0x345f1b,(char *)0x1569,"check failed: %s","pos <= len || pos == npos");
        }
        if (local_90 == 0xffffffffffffffff) {
          local_80 = local_1c0.str;
          local_78 = local_1c0.len;
        }
        else {
          basic_substring<const_char>::basic_substring
                    ((basic_substring<const_char> *)
                     CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0),
                     (char *)in_stack_fffffffffffff7c8,in_stack_fffffffffffff7c0);
        }
        local_2e0 = local_80;
        local_2d8 = local_78;
        local_1d0.str = local_80;
        local_1d0.len = local_78;
        this_00 = in_stack_fffffffffffff7b0;
        l = in_stack_fffffffffffff7b8;
        n = in_stack_fffffffffffff7c8;
        if (local_78 < 3) {
          builtin_strncpy(local_308,"check failed: (t.len >= 3)",0x1b);
          eVar13 = get_error_flags();
          if (((eVar13 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
            trap_instruction();
          }
          in_stack_fffffffffffff920 = (in_RDI->m_stack).m_callbacks.m_error;
          in_stack_fffffffffffff918 = local_308;
          Location::Location((Location *)
                             CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0),
                             (char *)in_stack_fffffffffffff7c8,in_stack_fffffffffffff7c0,
                             in_stack_fffffffffffff7b8,(size_t)in_stack_fffffffffffff7b0);
          in_stack_fffffffffffff7ac = (flag_t)((ulong)local_330 >> 0x20);
          LVar3.super_LineCol.line = (size_t)pPStack_328;
          LVar3.super_LineCol.offset = local_330;
          LVar3.super_LineCol.col = local_320;
          LVar3.name.str = (char *)sStack_318;
          LVar3.name.len = (size_t)local_310;
          (*in_stack_fffffffffffff920)
                    (in_stack_fffffffffffff918,0x1b,LVar3,(in_RDI->m_stack).m_callbacks.m_user_data)
          ;
          this_00 = pPStack_328;
          l = local_320;
          in_stack_fffffffffffff7c0 = sStack_318;
          n = local_310;
        }
      }
      else {
        bVar10 = basic_substring<const_char>::begins_with(&local_1c0,'!');
        this_00 = in_stack_fffffffffffff7b0;
        l = in_stack_fffffffffffff7b8;
        n = in_stack_fffffffffffff7c8;
        if (bVar10) {
          local_c0 = basic_substring<const_char>::first_of
                               (in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d7,
                                (size_t)in_stack_fffffffffffff7c8);
          in_stack_fffffffffffff908 = &local_1c0;
          in_stack_fffffffffffff917 = local_c0 <= local_1c0.len || local_c0 == 0xffffffffffffffff;
          local_b8 = in_stack_fffffffffffff908;
          if (local_c0 > local_1c0.len && local_c0 != 0xffffffffffffffff) {
            eVar13 = get_error_flags();
            if (((eVar13 & 1) != 0) &&
               (in_stack_fffffffffffff907 = is_debugger_attached(), (bool)in_stack_fffffffffffff907)
               ) {
              trap_instruction();
            }
            local_d0 = 
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            ;
            local_c8 = 0x1569;
            handle_error(0x345f1b,(char *)0x1569,"check failed: %s","pos <= len || pos == npos");
          }
          if (local_c0 == 0xffffffffffffffff) {
            local_b0 = in_stack_fffffffffffff908->str;
            local_a8 = in_stack_fffffffffffff908->len;
          }
          else {
            basic_substring<const_char>::basic_substring
                      ((basic_substring<const_char> *)
                       CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0),
                       (char *)in_stack_fffffffffffff7c8,in_stack_fffffffffffff7c0);
          }
          local_1d0.str = local_b0;
          local_1d0.len = local_a8;
          this_00 = in_stack_fffffffffffff7b0;
          l = in_stack_fffffffffffff7b8;
          n = in_stack_fffffffffffff7c8;
          if (local_a8 == 0) {
            eVar13 = get_error_flags();
            this_00 = in_stack_fffffffffffffc78;
            l = in_stack_fffffffffffffc80;
            n = in_stack_fffffffffffffc90;
            if (((eVar13 & 1) != 0) &&
               (bVar10 = is_debugger_attached(), this_00 = in_stack_fffffffffffffc78,
               l = in_stack_fffffffffffffc80, n = in_stack_fffffffffffffc90, bVar10)) {
              trap_instruction();
              this_00 = in_stack_fffffffffffffc78;
              l = in_stack_fffffffffffffc80;
              n = in_stack_fffffffffffffc90;
            }
            p_Var17 = (in_RDI->m_stack).m_callbacks.m_error;
            Location::Location((Location *)
                               CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0),
                               (char *)in_stack_fffffffffffff7c8,in_stack_fffffffffffff7c0,
                               in_stack_fffffffffffff7b8,(size_t)in_stack_fffffffffffff7b0);
            in_stack_fffffffffffff7ac = (flag_t)((ulong)in_stack_fffffffffffffc70 >> 0x20);
            LVar4.super_LineCol.line = (size_t)this_00;
            LVar4.super_LineCol.offset = (size_t)in_stack_fffffffffffffc70;
            LVar4.super_LineCol.col = l;
            LVar4.name.str = (char *)sStack_378;
            LVar4.name.len = (size_t)n;
            in_stack_fffffffffffffc78 = this_00;
            in_stack_fffffffffffffc80 = l;
            (*p_Var17)(&stack0xfffffffffffffc98,0x1b,LVar4,(in_RDI->m_stack).m_callbacks.m_user_data
                      );
            in_stack_fffffffffffff7c0 = sStack_378;
          }
        }
      }
    }
  }
  local_148 = &local_1d0;
  local_711 = local_1d0.len == 0 || local_1d0.str == (char *)0x0;
  if (local_711) {
    local_1a1 = false;
  }
  else {
    bVar10 = has_all(in_RDI,0x220);
    if (bVar10) {
      bVar10 = has_any(in_RDI,0x40);
      if (!bVar10) {
        builtin_strncpy(local_3b8,"check failed: (has_any(RKEY))",0x1e);
        eVar13 = get_error_flags();
        if (((eVar13 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
          trap_instruction();
        }
        p_Var17 = (in_RDI->m_stack).m_callbacks.m_error;
        Location::Location((Location *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0)
                           ,(char *)n,in_stack_fffffffffffff7c0,l,(size_t)this_00);
        in_stack_fffffffffffff7ac = (flag_t)((ulong)local_3e0 >> 0x20);
        LVar5.super_LineCol.line = (size_t)pPStack_3d8;
        LVar5.super_LineCol.offset = local_3e0;
        LVar5.super_LineCol.col = local_3d0;
        LVar5.name.str = (char *)sStack_3c8;
        LVar5.name.len = (size_t)local_3c0;
        (*p_Var17)(local_3b8,0x1e,LVar5,(in_RDI->m_stack).m_callbacks.m_user_data);
        this_00 = pPStack_3d8;
        l = local_3d0;
        in_stack_fffffffffffff7c0 = sStack_3c8;
        n = local_3c0;
      }
      _append_key_val_null(in_stack_fffffffffffff870,in_stack_fffffffffffff868);
      rem_flags(this_00,in_stack_fffffffffffff7ac);
    }
    local_3f8 = local_1d0.str;
    local_3f0 = local_1d0.len;
    s.len._0_7_ = in_stack_fffffffffffff860;
    s.str = (char *)in_stack_fffffffffffff858;
    s.len._7_1_ = in_stack_fffffffffffff867;
    local_3e8 = LineContents::current_col
                          ((LineContents *)
                           CONCAT17(in_stack_fffffffffffff857,in_stack_fffffffffffff850),s);
    local_188 = &local_1d0;
    local_198 = &(in_RDI->m_state->line_contents).rem;
    if (local_1d0.str + local_1d0.len <= local_198->str) {
      memcpy(local_438,"check failed: (t.end() > m_state->line_contents.rem.begin())",0x3d);
      eVar13 = get_error_flags();
      if (((eVar13 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
        trap_instruction();
      }
      p_Var17 = (in_RDI->m_stack).m_callbacks.m_error;
      Location::Location((Location *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0),
                         (char *)n,in_stack_fffffffffffff7c0,l,(size_t)this_00);
      LVar6.super_LineCol.line = (size_t)pPStack_458;
      LVar6.super_LineCol.offset = local_460;
      LVar6.super_LineCol.col = local_450;
      LVar6.name.str = (char *)sStack_448;
      LVar6.name.len = (size_t)local_440;
      (*p_Var17)(local_438,0x3d,LVar6,(in_RDI->m_stack).m_callbacks.m_user_data);
      this_00 = pPStack_458;
      l = local_450;
      in_stack_fffffffffffff7c0 = sStack_448;
      n = local_440;
    }
    local_190 = &local_1d0;
    local_1a0 = &(in_RDI->m_state->line_contents).rem;
    _line_progressed((Parser *)CONCAT17(in_stack_fffffffffffff897,in_stack_fffffffffffff890),
                     (size_t)in_stack_fffffffffffff888);
    basic_substring<char_const>::basic_substring<3ul>(local_478,(char (*) [3])" \t");
    chars.str._7_1_ = in_stack_fffffffffffff7f7;
    chars.str._0_7_ = in_stack_fffffffffffff7f0;
    chars.len = (size_t)in_stack_fffffffffffff7f8;
    local_468 = basic_substring<const_char>::first_not_of
                          (in_stack_fffffffffffff7e8,chars,in_stack_fffffffffffff7e0);
    if (local_468 != 0xffffffffffffffff) {
      _line_progressed((Parser *)CONCAT17(in_stack_fffffffffffff897,in_stack_fffffffffffff890),
                       (size_t)in_stack_fffffffffffff888);
    }
    bVar10 = has_all(in_RDI,0x44);
    if (bVar10) {
      local_150 = &in_RDI->m_key_tag;
      bVar10 = true;
      if ((in_RDI->m_key_tag).len != 0) {
        bVar10 = local_150->str == (char *)0x0;
      }
      if (!bVar10) {
        memcpy(local_4a8,"check failed: (m_key_tag.empty())",0x22);
        eVar13 = get_error_flags();
        if (((eVar13 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
          trap_instruction();
        }
        p_Var17 = (in_RDI->m_stack).m_callbacks.m_error;
        Location::Location((Location *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0)
                           ,(char *)n,in_stack_fffffffffffff7c0,l,(size_t)this_00);
        LVar7.super_LineCol.line = uStack_4c8;
        LVar7.super_LineCol.offset = local_4d0;
        LVar7.super_LineCol.col = local_4c0;
        LVar7.name.str = (char *)uStack_4b8;
        LVar7.name.len = local_4b0;
        (*p_Var17)(local_4a8,0x22,LVar7,(in_RDI->m_stack).m_callbacks.m_user_data);
      }
      (in_RDI->m_key_tag).str = local_1d0.str;
      (in_RDI->m_key_tag).len = local_1d0.len;
      in_RDI->m_key_tag_indentation = local_3e8;
    }
    else {
      bVar10 = has_all(in_RDI,0x84);
      if (bVar10) {
        local_1c0 = (in_RDI->m_state->line_contents).rem;
        basic_substring<char_const>::basic_substring<2ul>(local_4f0,(char (*) [2])0x359e5b);
        pattern_02.str._7_1_ = in_stack_fffffffffffff807;
        pattern_02.str._0_7_ = in_stack_fffffffffffff800;
        pattern_02.len = (size_t)in_stack_fffffffffffff808;
        local_f0 = basic_substring<const_char>::find
                             (in_stack_fffffffffffff7f8,pattern_02,
                              CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0));
        in_stack_fffffffffffff888 = &local_1c0;
        in_stack_fffffffffffff897 = local_f0 <= local_1c0.len || local_f0 == 0xffffffffffffffff;
        local_e8 = in_stack_fffffffffffff888;
        if (local_f0 > local_1c0.len && local_f0 != 0xffffffffffffffff) {
          eVar13 = get_error_flags();
          if (((eVar13 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
            trap_instruction();
          }
          local_100 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_f8 = 0x1569;
          handle_error(0x345f1b,(char *)0x1569,"check failed: %s","pos <= len || pos == npos");
        }
        if (local_f0 == 0xffffffffffffffff) {
          local_e0 = in_stack_fffffffffffff888->str;
          local_d8 = in_stack_fffffffffffff888->len;
        }
        else {
          basic_substring<const_char>::basic_substring
                    ((basic_substring<const_char> *)
                     CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0),(char *)n,
                     in_stack_fffffffffffff7c0);
        }
        local_4e0 = local_e0;
        local_4d8 = local_d8;
        basic_substring<char_const>::basic_substring<3ul>(local_510,(char (*) [3])" \t");
        chars_01.str._6_1_ = in_stack_fffffffffffff846;
        chars_01.str._0_6_ = in_stack_fffffffffffff840;
        chars_01.str._7_1_ = in_stack_fffffffffffff847;
        chars_01.len = in_stack_fffffffffffff848;
        local_500 = basic_substring<const_char>::trimr(in_stack_fffffffffffff838,chars_01);
        local_158 = &in_RDI->m_val_tag;
        bVar10 = true;
        if ((in_RDI->m_val_tag).len != 0) {
          bVar10 = local_158->str == (char *)0x0;
        }
        local_1c0 = local_500;
        if (!bVar10) {
          memcpy(local_538,"check failed: (m_val_tag.empty())",0x22);
          eVar13 = get_error_flags();
          if (((eVar13 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
            trap_instruction();
          }
          p_Var17 = (in_RDI->m_stack).m_callbacks.m_error;
          pcVar16 = local_538;
          Location::Location((Location *)
                             CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0),(char *)n
                             ,in_stack_fffffffffffff7c0,l,(size_t)this_00);
          LVar8.super_LineCol.line = (size_t)pcStack_558;
          LVar8.super_LineCol.offset = local_560;
          LVar8.super_LineCol.col = local_550;
          LVar8.name.str = (char *)sStack_548;
          LVar8.name.len = (size_t)local_540;
          (*p_Var17)(pcVar16,0x22,LVar8,(in_RDI->m_stack).m_callbacks.m_user_data);
        }
        (in_RDI->m_val_tag).str = local_1d0.str;
        (in_RDI->m_val_tag).len = local_1d0.len;
        in_RDI->m_val_tag_indentation = local_3e8;
      }
      else {
        bVar10 = has_all(in_RDI,0x88);
        if ((bVar10) || (bVar10 = has_all(in_RDI,0x1003), bVar10)) {
          local_160 = &in_RDI->m_val_tag;
          bVar10 = true;
          if ((in_RDI->m_val_tag).len != 0) {
            bVar10 = local_160->str == (char *)0x0;
          }
          if (bVar10) {
            (in_RDI->m_val_tag).str = local_1d0.str;
            (in_RDI->m_val_tag).len = local_1d0.len;
            in_RDI->m_val_tag_indentation = local_3e8;
          }
          else {
            (in_RDI->m_key_tag).str = local_1d0.str;
            (in_RDI->m_key_tag).len = local_1d0.len;
            in_RDI->m_key_tag_indentation = local_3e8;
          }
        }
        else {
          bVar10 = has_all(in_RDI,3);
          if ((bVar10) || (bVar10 = has_any(in_RDI,2), bVar10)) {
            local_1c0 = (in_RDI->m_state->line_contents).rem;
            basic_substring<char_const>::basic_substring<2ul>(local_580,(char (*) [2])0x359e5b);
            pattern_03.str._7_1_ = in_stack_fffffffffffff807;
            pattern_03.str._0_7_ = in_stack_fffffffffffff800;
            pattern_03.len = (size_t)in_stack_fffffffffffff808;
            local_120 = basic_substring<const_char>::find
                                  (in_stack_fffffffffffff7f8,pattern_03,
                                   CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0));
            pbVar15 = &local_1c0;
            local_118 = pbVar15;
            if (local_1c0.len < local_120 && local_120 != 0xffffffffffffffff) {
              eVar13 = get_error_flags();
              if (((eVar13 & 1) != 0) &&
                 (in_stack_fffffffffffff847 = is_debugger_attached(),
                 (bool)in_stack_fffffffffffff847)) {
                trap_instruction();
              }
              local_130 = 
              "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
              ;
              local_128 = 0x1569;
              handle_error(0x345f1b,(char *)0x1569,"check failed: %s","pos <= len || pos == npos");
            }
            if (local_120 == 0xffffffffffffffff) {
              local_110 = (pfn_error)pbVar15->str;
              local_108 = (char *)pbVar15->len;
            }
            else {
              basic_substring<const_char>::basic_substring
                        ((basic_substring<const_char> *)
                         CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0),(char *)n,
                         in_stack_fffffffffffff7c0);
            }
            local_570 = local_110;
            local_568 = local_108;
            basic_substring<char_const>::basic_substring<3ul>
                      ((basic_substring<char_const> *)(local_5c8 + 0x28),(char (*) [3])" \t");
            chars_02.str._6_1_ = in_stack_fffffffffffff846;
            chars_02.str._0_6_ = in_stack_fffffffffffff840;
            chars_02.str._7_1_ = in_stack_fffffffffffff847;
            chars_02.len = (size_t)pbVar15;
            local_590 = basic_substring<const_char>::trimr(in_stack_fffffffffffff838,chars_02);
            local_168 = &local_1c0;
            local_1c0.len = local_590.len;
            bVar10 = true;
            if (local_1c0.len != 0) {
              local_1c0.str = local_590.str;
              bVar10 = local_1c0.str == (char *)0x0;
            }
            local_1c0 = local_590;
            if (bVar10) {
              in_stack_fffffffffffff828 = &in_RDI->m_val_tag;
              bVar10 = true;
              if ((in_RDI->m_val_tag).len != 0) {
                bVar10 = in_stack_fffffffffffff828->str == (char *)0x0;
              }
              local_170 = in_stack_fffffffffffff828;
              if (!bVar10) {
                memcpy(local_5c8,"check failed: (m_val_tag.empty())",0x22);
                eVar13 = get_error_flags();
                if (((eVar13 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
                  trap_instruction();
                }
                in_stack_fffffffffffff820 = (in_RDI->m_stack).m_callbacks.m_error;
                in_stack_fffffffffffff818 = (Tree *)local_5c8;
                Location::Location((Location *)
                                   CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0),
                                   (char *)n,in_stack_fffffffffffff7c0,l,(size_t)this_00);
                LVar9.super_LineCol.line = uStack_5e8;
                LVar9.super_LineCol.offset = local_5f0;
                LVar9.super_LineCol.col = local_5e0;
                LVar9.name.str = (char *)uStack_5d8;
                LVar9.name.len = local_5d0;
                (*in_stack_fffffffffffff820)
                          ((char *)in_stack_fffffffffffff818,0x22,LVar9,
                           (in_RDI->m_stack).m_callbacks.m_user_data);
              }
              (in_RDI->m_val_tag).str = local_1d0.str;
              (in_RDI->m_val_tag).len = local_1d0.len;
              in_RDI->m_val_tag_indentation = local_3e8;
            }
            else {
              in_stack_fffffffffffff808 = &in_RDI->m_key_tag;
              in_stack_fffffffffffff817 = true;
              if ((in_RDI->m_key_tag).len != 0) {
                in_stack_fffffffffffff817 = in_stack_fffffffffffff808->str == (char *)0x0;
              }
              local_178 = in_stack_fffffffffffff808;
              if ((bool)in_stack_fffffffffffff817 == false) {
                (in_RDI->m_key_tag2).str = local_1d0.str;
                (in_RDI->m_key_tag2).len = local_1d0.len;
                in_RDI->m_key_tag2_indentation = local_3e8;
              }
              else {
                (in_RDI->m_key_tag).str = local_1d0.str;
                (in_RDI->m_key_tag).len = local_1d0.len;
                in_RDI->m_key_tag_indentation = local_3e8;
              }
            }
          }
          else {
            bVar10 = is_debugger_attached();
            if ((bVar10) && (bVar10 = is_debugger_attached(), bVar10)) {
              trap_instruction();
            }
            basic_substring<char_const>::basic_substring<22ul>
                      ((basic_substring<char_const> *)&stack0xfffffffffffffa00,
                       (char (*) [22])"ERROR: internal error");
            fmt.len = in_stack_fffffffffffffc80;
            fmt.str = (char *)in_stack_fffffffffffffc78;
            _err<>(in_stack_fffffffffffffc70,fmt);
          }
        }
      }
    }
    node = &in_RDI->m_val_tag;
    uVar14 = false;
    if ((in_RDI->m_val_tag).len != 0) {
      uVar14 = node->str != (char *)0x0;
    }
    if ((((bool)uVar14 != false) &&
        (tag_02.len._0_7_ = in_stack_fffffffffffff890,
        tag_02.str = (char *)in_stack_fffffffffffff888, tag_02.len._7_1_ = in_stack_fffffffffffff897
        , local_8 = node, YVar11 = to_tag(tag_02), YVar11 == TAG_STR)) &&
       (bVar10 = has_all(in_RDI,0x1003), bVar10)) {
      _slurp_doc_scalar(in_stack_fffffffffffffa00);
      val.len = (size_t)in_stack_fffffffffffff920;
      val.str = in_stack_fffffffffffff918;
      Tree::to_val((Tree *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
                   (size_t)in_stack_fffffffffffff908,val,
                   CONCAT17(in_stack_fffffffffffff907,in_stack_fffffffffffff900));
      tag_00.len._0_7_ = in_stack_fffffffffffff800;
      tag_00.str = (char *)node;
      tag_00.len._7_1_ = uVar14;
      normalize_tag(tag_00);
      tag_01.len._0_7_ = in_stack_fffffffffffff810;
      tag_01.str = (char *)in_stack_fffffffffffff808;
      tag_01.len._7_1_ = in_stack_fffffffffffff817;
      Tree::set_val_tag((Tree *)CONCAT17(uVar14,in_stack_fffffffffffff800),(size_t)node,tag_01);
      basic_substring<const_char>::clear(&in_RDI->m_val_tag);
      local_180 = &in_RDI->m_val_anchor;
      bVar10 = true;
      if ((in_RDI->m_val_anchor).len != 0) {
        bVar10 = local_180->str == (char *)0x0;
      }
      if (!bVar10) {
        anchor.len = (size_t)in_stack_fffffffffffff828;
        anchor.str = (char *)in_stack_fffffffffffff820;
        Tree::set_val_anchor
                  (in_stack_fffffffffffff818,
                   CONCAT17(in_stack_fffffffffffff817,in_stack_fffffffffffff810),anchor);
        basic_substring<const_char>::clear(&in_RDI->m_val_anchor);
      }
      _end_stream((Parser *)CONCAT26(YVar11,in_stack_fffffffffffff9f8));
    }
    local_1a1 = true;
  }
  return local_1a1;
}

Assistant:

bool Parser::_handle_types()
{
    csubstr rem = m_state->line_contents.rem.triml(' ');
    csubstr t;

    if(rem.begins_with("!!"))
    {
        _c4dbgp("begins with '!!'");
        t = rem.left_of(rem.first_of(" ,"));
        _RYML_CB_ASSERT(m_stack.m_callbacks, t.len >= 2);
        //t = t.sub(2);
        if(t == "!!set")
            add_flags(RSET);
    }
    else if(rem.begins_with("!<"))
    {
        _c4dbgp("begins with '!<'");
        t = rem.left_of(rem.first_of('>'), true);
        _RYML_CB_ASSERT(m_stack.m_callbacks, t.len >= 2);
        //t = t.sub(2, t.len-1);
    }
    else if(rem.begins_with("!h!"))
    {
        _c4dbgp("begins with '!h!'");
        t = rem.left_of(rem.first_of(' '));
        _RYML_CB_ASSERT(m_stack.m_callbacks, t.len >= 3);
        //t = t.sub(3);
    }
    else if(rem.begins_with('!'))
    {
        _c4dbgp("begins with '!'");
        t = rem.left_of(rem.first_of(' '));
        _RYML_CB_ASSERT(m_stack.m_callbacks, t.len >= 1);
        //t = t.sub(1);
    }

    if(t.empty())
        return false;

    if(has_all(QMRK|SSCL))
    {
        _RYML_CB_ASSERT(m_stack.m_callbacks, has_any(RKEY));
        _c4dbgp("there is a stored key, so this tag is for the next element");
        _append_key_val_null(rem.str - 1);
        rem_flags(QMRK);
    }

    #ifdef RYML_NO_COVERAGE__TO_BE_DELETED
    const char *tag_beginning = rem.str;
    #endif
    size_t tag_indentation = m_state->line_contents.current_col(t);
    _c4dbgpf("there was a tag: '{}', indentation={}", t, tag_indentation);
    _RYML_CB_ASSERT(m_stack.m_callbacks, t.end() > m_state->line_contents.rem.begin());
    _line_progressed(static_cast<size_t>(t.end() - m_state->line_contents.rem.begin()));
    {
        size_t pos = m_state->line_contents.rem.first_not_of(" \t");
        if(pos != csubstr::npos)
            _line_progressed(pos);
    }

    if(has_all(RMAP|RKEY))
    {
        _c4dbgpf("saving map key tag '{}'", t);
        _RYML_CB_ASSERT(m_stack.m_callbacks, m_key_tag.empty());
        m_key_tag = t;
        m_key_tag_indentation = tag_indentation;
    }
    else if(has_all(RMAP|RVAL))
    {
        /* foo: !!str
         * !!str : bar  */
        rem = m_state->line_contents.rem;
        rem = rem.left_of(rem.find("#"));
        rem = rem.trimr(" \t");
        _c4dbgpf("rem='{}'", rem);
        #ifdef RYML_NO_COVERAGE__TO_BE_DELETED
        if(rem == ':' || rem.begins_with(": "))
        {
            _c4dbgp("the last val was null, and this is a tag from a null key");
            _append_key_val_null(tag_beginning - 1);
            _store_scalar_null(rem.str - 1);
            // do not change the flag to key, it is ~
            _RYML_CB_ASSERT(m_stack.m_callbacks, rem.begin() > m_state->line_contents.rem.begin());
            size_t token_len = rem == ':' ? 1 : 2;
            _line_progressed(static_cast<size_t>(token_len + rem.begin() - m_state->line_contents.rem.begin()));
        }
        #endif
        _c4dbgpf("saving map val tag '{}'", t);
        _RYML_CB_ASSERT(m_stack.m_callbacks, m_val_tag.empty());
        m_val_tag = t;
        m_val_tag_indentation = tag_indentation;
    }
    else if(has_all(RSEQ|RVAL) || has_all(RTOP|RUNK|NDOC))
    {
        if(m_val_tag.empty())
        {
            _c4dbgpf("saving seq/doc val tag '{}'", t);
            m_val_tag = t;
            m_val_tag_indentation = tag_indentation;
        }
        else
        {
            _c4dbgpf("saving seq/doc key tag '{}'", t);
            m_key_tag = t;
            m_key_tag_indentation = tag_indentation;
        }
    }
    else if(has_all(RTOP|RUNK) || has_any(RUNK))
    {
        rem = m_state->line_contents.rem;
        rem = rem.left_of(rem.find("#"));
        rem = rem.trimr(" \t");
        if(rem.empty())
        {
            _c4dbgpf("saving val tag '{}'", t);
            _RYML_CB_ASSERT(m_stack.m_callbacks, m_val_tag.empty());
            m_val_tag = t;
            m_val_tag_indentation = tag_indentation;
        }
        else
        {
            _c4dbgpf("saving key tag '{}'", t);
            if(m_key_tag.empty())
            {
                m_key_tag = t;
                m_key_tag_indentation = tag_indentation;
            }
            else
            {
                /* handle this case:
                 * !!str foo: !!map
                 *   !!int 1: !!float 20.0
                 *   !!int 3: !!float 40.0
                 *
                 * (m_key_tag would be !!str and m_key_tag2 would be !!int)
                 */
                m_key_tag2 = t;
                m_key_tag2_indentation = tag_indentation;
            }
        }
    }
    else
    {
        _c4err("internal error");
    }

    if(m_val_tag.not_empty())
    {
        YamlTag_e tag = to_tag(t);
        if(tag == TAG_STR)
        {
            _c4dbgpf("tag '{}' is a str-type tag", t);
            if(has_all(RTOP|RUNK|NDOC))
            {
                _c4dbgpf("docval. slurping the string. pos={}", m_state->pos.offset);
                csubstr scalar = _slurp_doc_scalar();
                _c4dbgpf("docval. after slurp: {}, at node {}: '{}'", m_state->pos.offset, m_state->node_id, scalar);
                m_tree->to_val(m_state->node_id, scalar, DOC);
                _c4dbgpf("docval. val tag {} -> {}", m_val_tag, normalize_tag(m_val_tag));
                m_tree->set_val_tag(m_state->node_id, normalize_tag(m_val_tag));
                m_val_tag.clear();
                if(!m_val_anchor.empty())
                {
                    _c4dbgpf("setting val anchor[{}]='{}'", m_state->node_id, m_val_anchor);
                    m_tree->set_val_anchor(m_state->node_id, m_val_anchor);
                    m_val_anchor.clear();
                }
                _end_stream();
            }
        }
    }
    return true;
}